

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printjava.cc
# Opt level: O2

void __thiscall PrintJavaCapability::PrintJavaCapability(PrintJavaCapability *this)

{
  PrintLanguageCapability::PrintLanguageCapability(&this->super_PrintLanguageCapability);
  (this->super_PrintLanguageCapability).super_CapabilityPoint._vptr_CapabilityPoint =
       (_func_int **)&PTR__PrintLanguageCapability_003fdb20;
  std::__cxx11::string::assign((char *)&(this->super_PrintLanguageCapability).name);
  (this->super_PrintLanguageCapability).isdefault = false;
  return;
}

Assistant:

PrintJavaCapability::PrintJavaCapability(void)

{
  name = "java-language";
  isdefault = false;
}